

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O0

copy_on_write<DerivedType> *
make_copy_on_write<DerivedType,int&>(copy_on_write<DerivedType> *__return_storage_ptr__,int *ts)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  unique_ptr<direct_shared_control_block<DerivedType,_DerivedType>,_std::default_delete<direct_shared_control_block<DerivedType,_DerivedType>_>_>
  local_38;
  undefined1 local_30 [8];
  copy_on_write<DerivedType> p;
  int *ts_local;
  
  p.cb_.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ts;
  copy_on_write<DerivedType>::copy_on_write((copy_on_write<DerivedType> *)local_30);
  std::make_unique<direct_shared_control_block<DerivedType,DerivedType>,int&>((int *)&local_38);
  std::shared_ptr<shared_control_block<DerivedType>>::operator=
            ((shared_ptr<shared_control_block<DerivedType>> *)&p,&local_38);
  std::
  unique_ptr<direct_shared_control_block<DerivedType,_DerivedType>,_std::default_delete<direct_shared_control_block<DerivedType,_DerivedType>_>_>
  ::~unique_ptr(&local_38);
  peVar2 = std::
           __shared_ptr_access<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&p);
  iVar1 = (*peVar2->_vptr_shared_control_block[3])();
  local_30 = (undefined1  [8])CONCAT44(extraout_var,iVar1);
  copy_on_write<DerivedType>::copy_on_write
            (__return_storage_ptr__,(copy_on_write<DerivedType> *)local_30);
  copy_on_write<DerivedType>::~copy_on_write((copy_on_write<DerivedType> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

copy_on_write<T> make_copy_on_write(Ts&&... ts)
{
  copy_on_write<T> p;
  p.cb_ = std::make_unique<direct_shared_control_block<T>>(std::forward<Ts>(ts)...);
  p.ptr_ = p.cb_->ptr();
  return std::move(p);
}